

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<true>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  undefined1 *puVar1;
  uint32 *puVar2;
  undefined **ppuVar3;
  CharSetNode *pCVar4;
  code *pcVar5;
  undefined2 uVar6;
  EncodedChar **ppEVar7;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar8;
  bool bVar9;
  OLECHAR OVar10;
  uint uVar11;
  int iVar12;
  codepoint_t cVar13;
  uint uVar14;
  uint uVar15;
  undefined4 *puVar16;
  Node *pNVar17;
  EncodedCharPtr puVar18;
  SurrogatePairTracker *pSVar19;
  ulong uVar20;
  undefined4 extraout_var;
  Node *pNVar21;
  AltNode *pAVar22;
  AltNode *pAVar23;
  Char lc;
  long *plVar24;
  EncodedCharPtr puVar25;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar26;
  ArenaAllocator *pAVar27;
  CharSet<unsigned_int> *pCVar28;
  Char CVar29;
  uint uVar30;
  long lVar31;
  utf8char_t uVar32;
  int iVar33;
  MatchSetNode *node;
  NodeTag *pNVar34;
  byte bVar35;
  uint totalCount;
  uint uVar36;
  ulong uVar37;
  AltNode *lastAltNode;
  undefined1 auVar38 [16];
  undefined1 local_928 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  MatchSetNode local_3d8;
  undefined1 local_370 [8];
  CharSet<unsigned_int> codePointSet;
  Char local_6c;
  int iStack_68;
  codepoint_t upperCharOfRange;
  undefined4 *local_60;
  CharSet<unsigned_int> *local_58;
  bool local_4d;
  Char local_4c;
  bool previousWasASurrogate;
  EncodedChar **ppEStack_48;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_40;
  utf8char_t local_31;
  
  local_40 = this;
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar9) goto LAB_00ecb7a0;
    *puVar16 = 0;
  }
  local_58 = (CharSet<unsigned_int> *)local_370;
  CharSet<unsigned_int>::CharSet(local_58);
  local_3d8.super_Node.tag = MatchSet;
  local_3d8.super_Node.features = 0;
  local_3d8.super_Node._12_4_ = local_3d8.super_Node._12_4_ & 0xffff8000;
  local_3d8.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  local_3d8.super_Node.followSet = (CharSet<char16_t> *)0x0;
  local_3d8.super_Node.prevConsumes.lower = 0;
  local_3d8.super_Node.prevConsumes.upper = 0xffffffff;
  local_3d8.super_Node.thisConsumes.lower = 0;
  local_3d8.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d8.super_Node.followConsumes.lower = 0;
  local_3d8.super_Node.followConsumes.upper = 0xffffffff;
  local_3d8.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  local_3d8.isNegation = false;
  local_3d8.needsEquivClass = true;
  CharSet<char16_t>::CharSet(&local_3d8.set);
  pPVar26 = local_40;
  pmovsxbd(ZEXT816(0),0xff00ff);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01542a10;
  puVar18 = local_40->inputLim;
  puVar25 = local_40->next;
  if (puVar18 < puVar25) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecb7a0;
    *puVar16 = 0;
    puVar18 = pPVar26->inputLim;
    puVar25 = pPVar26->next;
  }
  ppEStack_48 = &pPVar26->next;
  local_31 = *puVar25;
  if (*puVar25 == '^') {
    if (puVar18 < puVar25 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecb7a0;
      *puVar16 = 0;
      puVar25 = *ppEStack_48;
      if ((char)*puVar25 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        puVar25 = *ppEStack_48;
      }
    }
    puVar25 = puVar25 + 1;
    local_40->next = puVar25;
    puVar18 = local_40->inputLim;
    pPVar26 = local_40;
  }
  if (puVar18 < puVar25) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecb7a0;
    *puVar16 = 0;
    puVar25 = *ppEStack_48;
  }
  uVar32 = *puVar25;
  local_4d = false;
  if (uVar32 != ']') {
    lc = 0xffffffff;
    local_60 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar35 = 0;
    local_4c = 0xffffffff;
    uVar20 = 0;
LAB_00eca1db:
    pPVar26 = local_40;
    _iStack_68 = (Node *)CONCAT71(stack0xffffffffffffff99,bVar35);
    if (uVar32 == '\\') {
      if (local_40->inputLim < puVar25 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_60;
        *local_60 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        puVar25 = *ppEStack_48;
      }
      if ((char)*puVar25 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_60;
        *local_60 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        puVar25 = *ppEStack_48;
      }
      puVar25 = puVar25 + 1;
      *ppEStack_48 = puVar25;
    }
    pSVar19 = pPVar26->currentSurrogatePairNode;
    CVar29 = lc;
    if ((pSVar19 == (SurrogatePairTracker *)0x0) || (pSVar19->location != puVar25)) {
      if (uVar32 == '\\') {
        pNVar17 = ClassEscapePass1(pPVar26,(MatchCharNode *)
                                           (codePointSet.characterPlanes[0x10].rep.full.direct.vec +
                                           6),&local_3d8,&local_4d);
        if (pNVar17->tag != MatchSet) {
          cVar13 = 0;
          goto LAB_00eca5d5;
        }
        if (local_4c != 0xffffffff) {
          if (pPVar26->unicodeFlagPresent == true) {
            Fail(pPVar26,-0x7ff5e9d3);
          }
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_370,pPVar26->ctAllocator,0x2d,0x2d);
        }
        CharSet<unsigned_int>::UnionInPlace
                  ((CharSet<unsigned_int> *)local_370,pPVar26->ctAllocator,&local_3d8.set);
        local_4c = 0xffffffff;
        bVar35 = 1;
        lc = 0xffffffff;
        goto LAB_00eca5d8;
      }
      if (uVar32 == '-') {
        puVar18 = pPVar26->inputLim;
        if (lc != 0xffffffff && local_4c == 0xffffffff) {
          if (puVar18 < puVar25 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_60;
            *local_60 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar9) goto LAB_00ecb7a0;
            *puVar16 = 0;
            puVar18 = pPVar26->inputLim;
            puVar25 = pPVar26->next;
          }
          if (puVar25[1] != ']') {
            if (puVar18 < puVar25 + 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = local_60;
              *local_60 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar9) goto LAB_00ecb7a0;
              *puVar16 = 0;
              puVar25 = *ppEStack_48;
            }
            if ((char)*puVar25 < '\0') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = local_60;
              *local_60 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                                 "!this->IsMultiUnitChar(next[i])");
              if (!bVar9) goto LAB_00ecb7a0;
              *puVar16 = 0;
              puVar25 = *ppEStack_48;
            }
            *ppEStack_48 = puVar25 + 1;
            CVar29 = 0xffffffff;
            bVar35 = 0;
            local_4c = lc;
            goto LAB_00eca5d8;
          }
        }
        puVar16 = local_60;
        if (puVar18 < puVar25 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ecb7a0;
          *puVar16 = 0;
          puVar25 = *ppEStack_48;
        }
        if ((char)*puVar25 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar9) goto LAB_00ecb7a0;
          *puVar16 = 0;
          puVar25 = *ppEStack_48;
        }
        *ppEStack_48 = puVar25 + 1;
        cVar13 = 0x2d;
        goto LAB_00eca5d5;
      }
      puVar18 = pPVar26->inputLim;
      if (puVar18 <= puVar25) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_60;
        *local_60 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        puVar18 = pPVar26->inputLim;
      }
      OVar10 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                         (&pPVar26->super_UTF8EncodingPolicyBase<false>,ppEStack_48,puVar18);
      cVar13 = (codepoint_t)(ushort)OVar10;
    }
    else {
      cVar13 = pSVar19->value;
      uVar37 = (ulong)pSVar19->length;
      puVar18 = pPVar26->inputLim;
      if (puVar18 < puVar25 + uVar37) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_60;
        *local_60 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                           "ECCanConsume(this->currentSurrogatePairNode->length)");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        pSVar19 = local_40->currentSurrogatePairNode;
        uVar37 = (ulong)pSVar19->length;
        puVar18 = local_40->inputLim;
        puVar25 = local_40->next;
      }
      if (puVar18 < puVar25 + uVar37) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_60;
        *local_60 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ecb7a0;
        *puVar16 = 0;
        puVar25 = local_40->next;
        pSVar19 = local_40->currentSurrogatePairNode;
      }
      local_40->next = puVar25 + uVar37;
      (local_40->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar19->multiUnits;
      local_40->currentSurrogatePairNode = pSVar19->next;
    }
LAB_00eca5d5:
    bVar35 = 0;
    lc = cVar13;
LAB_00eca5d8:
    pPVar26 = local_40;
    if ((~(byte)uVar20 & CVar29 == 0xffffffff) == 0) {
      if ((uVar20 & 1) == 0) {
        if (local_4c == 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_370,local_40->ctAllocator,CVar29,CVar29);
          local_4c = 0xffffffff;
          goto LAB_00eca6e3;
        }
        if (lc < local_4c) {
          if (local_40->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_60;
            *local_60 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar9) goto LAB_00ecb7a0;
            *puVar16 = 0;
          }
          Fail(local_40,-0x7ff5ec63);
        }
        pAVar27 = local_40->ctAllocator;
        pPVar26 = local_40;
        CVar29 = local_4c;
      }
      else {
        if (local_40->unicodeFlagPresent == true) {
          Fail(local_40,-0x7ff5e9d3);
        }
        pPVar26 = local_40;
        if (lc != 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)local_370,local_40->ctAllocator,lc,lc);
        }
        pAVar27 = pPVar26->ctAllocator;
        lc = 0x2d;
        CVar29 = 0x2d;
      }
      CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)local_370,pAVar27,CVar29,lc);
      local_4c = 0xffffffff;
      lc = 0xffffffff;
    }
LAB_00eca6e3:
    puVar25 = pPVar26->next;
    if (pPVar26->inputLim < puVar25) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = local_60;
      *local_60 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecb7a0;
      *puVar16 = 0;
      puVar25 = *ppEStack_48;
    }
    pPVar26 = local_40;
    uVar32 = *puVar25;
    bVar35 = bVar35 & uVar32 == '-';
    uVar20 = (ulong)_iStack_68 & 0xff;
    if (uVar32 == ']') goto LAB_00eca849;
    goto LAB_00eca1db;
  }
  goto LAB_00eca869;
LAB_00eca849:
  if (lc != 0xffffffff) {
    CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)local_370,local_40->ctAllocator,lc,lc);
  }
LAB_00eca869:
  if (pPVar26->unicodeFlagPresent == false) {
    if (&DAT_00000004 < (undefined1 *)((long)local_370 - 1U)) {
      if (local_370 == (undefined1  [8])0x0) {
        uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
        _iStack_68 = (Node *)CONCAT44(extraout_var,uVar11);
      }
      else {
        if ((local_370 != (undefined1  [8])&CharSetFull::Instance) &&
           (uVar30 = (*(*(_func_int ***)local_370)[0xb])(local_370,2), 0xff00 < uVar30)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ecb7a0;
          *puVar16 = 0;
        }
        uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
        if (local_370 == (undefined1  [8])&CharSetFull::Instance) {
          iVar33 = 0xff00;
        }
        else {
          iVar33 = (*(*(_func_int ***)local_370)[0xb])(local_370,2);
        }
        _iStack_68 = (Node *)(ulong)(iVar33 + uVar11);
      }
    }
    else {
      _iStack_68 = (Node *)(ulong)(local_370._0_4_ - 1);
    }
    ppEStack_48 = (EncodedChar **)__tls_get_addr(&PTR_01548f08);
    lVar31 = 0;
    iVar33 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar31));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar30 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar7 = ppEStack_48;
            *(undefined4 *)ppEStack_48 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecb7a0;
            *(undefined4 *)ppEVar7 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar31));
          ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar12 = 0xff00;
          }
          else {
            iVar12 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar11 = iVar12 + uVar11;
        }
      }
      else {
        uVar11 = (int)ppuVar3 - 1;
      }
      pPVar26 = local_40;
      iVar33 = iVar33 + uVar11;
      lVar31 = lVar31 + 0x28;
    } while (lVar31 != 0x2a8);
    if (iStack_68 != iVar33) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      ppEVar7 = ppEStack_48;
      *(undefined4 *)ppEStack_48 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                         "codePointSet.SimpleCharCount() == codePointSet.Count()");
      if (!bVar9) goto LAB_00ecb7a0;
      *(undefined4 *)ppEVar7 = 0;
    }
    pNVar17 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
    *(uint *)&pNVar17->field_0xc = *(uint *)&pNVar17->field_0xc & 0xffff8000;
    pNVar17->tag = MatchSet;
    pNVar17->features = 0;
    pNVar17->firstSet = (CharSet<char16_t> *)0x0;
    pNVar17->followSet = (CharSet<char16_t> *)0x0;
    (pNVar17->prevConsumes).lower = 0;
    auVar38 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar17->prevConsumes).upper = auVar38;
    (pNVar17->followConsumes).upper = 0xffffffff;
    pNVar17->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(bool *)&pNVar17[1]._vptr_Node = local_31 == '^';
    *(undefined1 *)((long)&pNVar17[1]._vptr_Node + 1) = 1;
    pNVar34 = &pNVar17[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
    pAVar27 = pPVar26->ctAllocator;
    pCVar28 = (CharSet<unsigned_int> *)local_370;
  }
  else {
    if (((pPVar26->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                         "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
      if (!bVar9) goto LAB_00ecb7a0;
      *puVar16 = 0;
    }
    if (local_370 == (undefined1  [8])&DAT_00000001) {
      uVar20 = 0xffffffffffffffff;
      plVar24 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
      do {
        if (uVar20 == 0xf) goto LAB_00eca91a;
        uVar20 = uVar20 + 1;
        lVar31 = *plVar24;
        plVar24 = plVar24 + 5;
      } while (lVar31 == 1);
      if (0xf < uVar20) {
LAB_00eca91a:
        pNVar17 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
        pNVar17->tag = MatchSet;
        pNVar17->features = 0;
        *(uint *)&pNVar17->field_0xc = *(uint *)&pNVar17->field_0xc & 0xffff8000;
        pNVar17->firstSet = (CharSet<char16_t> *)0x0;
        pNVar17->followSet = (CharSet<char16_t> *)0x0;
        (pNVar17->prevConsumes).lower = 0;
        auVar38 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
        *(undefined1 (*) [16])&(pNVar17->prevConsumes).upper = auVar38;
        (pNVar17->followConsumes).upper = 0xffffffff;
        pNVar17->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&pNVar17[1]._vptr_Node = 0x100;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar17[1].tag);
        return pNVar17;
      }
    }
    _iStack_68 = (Node *)&codePointSet;
    if ((local_31 != '^') && (pPVar26->caseInsensitiveFlagPresent == false)) {
      ppEStack_48 = (EncodedChar **)__tls_get_addr(&PTR_01548f08);
      lVar31 = 0;
      iVar33 = 0;
      do {
        ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
          if (ppuVar3 == (undefined **)0x0) {
            uVar11 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
          }
          else {
            if ((ppuVar3 != &CharSetFull::Instance) &&
               (uVar30 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar30)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar7 = ppEStack_48;
              *(undefined4 *)ppEStack_48 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ecb7a0;
              *(undefined4 *)ppEVar7 = 0;
            }
            uVar11 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
            ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
            if (ppuVar3 == &CharSetFull::Instance) {
              iVar12 = 0xff00;
            }
            else {
              iVar12 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
            }
            uVar11 = iVar12 + uVar11;
          }
        }
        else {
          uVar11 = (int)ppuVar3 - 1;
        }
        iVar33 = iVar33 + uVar11;
        lVar31 = lVar31 + 0x28;
      } while (lVar31 != 0x2a8);
      pPVar26 = local_40;
      if (iVar33 == 1) {
        cVar13 = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_370);
        pPVar26 = local_40;
        if (cVar13 < 0x10000) {
          pNVar17 = (Node *)new<Memory::ArenaAllocator>(0x48,local_40->ctAllocator,0x364470);
          pNVar17->tag = MatchChar;
          pNVar17->features = 0;
          *(uint *)&pNVar17->field_0xc = *(uint *)&pNVar17->field_0xc & 0xffff8000;
          pNVar17->firstSet = (CharSet<char16_t> *)0x0;
          pNVar17->followSet = (CharSet<char16_t> *)0x0;
          (pNVar17->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar17->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar17->thisConsumes).upper = 0xffffffff;
          (pNVar17->followConsumes).upper = 0xffffffff;
          pNVar17->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
          *(undefined1 *)&pNVar17[1].tag = Empty;
          auVar38 = pshuflw(ZEXT416(cVar13),ZEXT416(cVar13),0);
          pNVar17[1]._vptr_Node = (_func_int **)auVar38._0_8_;
        }
        else {
          if (local_40->unicodeFlagPresent == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar7 = ppEStack_48;
            *(undefined4 *)ppEStack_48 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
            if (!bVar9) goto LAB_00ecb7a0;
            *(undefined4 *)ppEVar7 = 0;
          }
          Js::NumberUtilities::CodePointAsSurrogatePair
                    (cVar13,(char16 *)local_928,
                     (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
          pPVar26 = local_40;
          pNVar17 = CreateSurrogatePairAtom
                              (local_40,local_928._0_2_,
                               negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
        }
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_370,pPVar26->ctAllocator);
        return pNVar17;
      }
    }
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_928);
    pPVar8 = local_40;
    if (pPVar26->caseInsensitiveFlagPresent == false) {
      if (local_31 == '^') {
        _iStack_68 = (Node *)&negatedSet;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)local_370,local_40->ctAllocator,
                   (CharSet<unsigned_int> *)local_928);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_370,pPVar8->ctAllocator);
        local_58 = (CharSet<unsigned_int> *)local_928;
      }
    }
    else {
      puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar2);
      local_58 = (CharSet<unsigned_int> *)local_370;
      CharSet<unsigned_int>::ToEquivClass
                (local_58,pPVar26->ctAllocator,(CharSet<unsigned_int> *)puVar2);
      ppEStack_48 = (EncodedChar **)__tls_get_addr(&PTR_01548f08);
      lVar31 = 0;
      uVar30 = 0;
      do {
        ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar31 + 0x20);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
          if (ppuVar3 == (undefined **)0x0) {
            uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar31));
          }
          else {
            if ((ppuVar3 != &CharSetFull::Instance) &&
               (uVar36 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar36)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar7 = ppEStack_48;
              *(undefined4 *)ppEStack_48 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ecb7a0;
              *(undefined4 *)ppEVar7 = 0;
            }
            uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar31));
            ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar31 + 0x20);
            if (ppuVar3 == &CharSetFull::Instance) {
              iVar33 = 0xff00;
            }
            else {
              iVar33 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
            }
            uVar11 = iVar33 + uVar11;
          }
        }
        else {
          uVar11 = (int)ppuVar3 - 1;
        }
        uVar30 = uVar30 + uVar11;
        lVar31 = lVar31 + 0x28;
      } while (lVar31 != 0x2a8);
      lVar31 = 0;
      uVar36 = 0;
      do {
        ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
        if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
          if (ppuVar3 == (undefined **)0x0) {
            uVar11 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
          }
          else {
            if ((ppuVar3 != &CharSetFull::Instance) &&
               (uVar14 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar14)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              ppEVar7 = ppEStack_48;
              *(undefined4 *)ppEStack_48 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00ecb7a0;
              *(undefined4 *)ppEVar7 = 0;
            }
            uVar11 = CharBitvec::Count((CharBitvec *)
                                       ((long)&codePointSet.characterPlanes[0].rep + lVar31));
            ppuVar3 = *(undefined ***)((long)(codePointSet.characterPlanes + -1) + 0x20 + lVar31);
            if (ppuVar3 == &CharSetFull::Instance) {
              iVar33 = 0xff00;
            }
            else {
              iVar33 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
            }
            uVar11 = iVar33 + uVar11;
          }
        }
        else {
          uVar11 = (int)ppuVar3 - 1;
        }
        pPVar26 = local_40;
        uVar36 = uVar36 + uVar11;
        lVar31 = lVar31 + 0x28;
      } while (lVar31 != 0x2a8);
      if (uVar30 < uVar36) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        ppEVar7 = ppEStack_48;
        *(undefined4 *)ppEStack_48 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                           "caseEquivalent.Count() >= codePointSet.Count()");
        if (!bVar9) goto LAB_00ecb7a0;
        *(undefined4 *)ppEVar7 = 0;
      }
      if (local_31 == '^') {
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_370,pPVar26->ctAllocator);
        puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)puVar2,pPVar26->ctAllocator,
                   (CharSet<unsigned_int> *)local_370);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar2,pPVar26->ctAllocator);
      }
      else {
        CharSet<unsigned_int>::CloneFrom
                  ((CharSet<unsigned_int> *)local_370,pPVar26->ctAllocator,
                   (CharSet<unsigned_int> *)
                   (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
      }
    }
    ppEStack_48 = (EncodedChar **)__tls_get_addr(&PTR_01548f08);
    pCVar28 = local_58;
    lVar31 = 0;
    uVar11 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)&local_58->characterPlanes[0].rep + lVar31);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar15 = CharBitvec::Count((CharBitvec *)
                                     ((long)&pCVar28->characterPlanes[0].rep + lVar31 + 8));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar30 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar30)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar7 = ppEStack_48;
            *(undefined4 *)ppEStack_48 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecb7a0;
            *(undefined4 *)ppEVar7 = 0;
          }
          uVar15 = CharBitvec::Count((CharBitvec *)
                                     ((long)&pCVar28->characterPlanes[0].rep + lVar31 + 8));
          ppuVar3 = *(undefined ***)((long)&local_58->characterPlanes[0].rep + lVar31);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar33 = 0xff00;
          }
          else {
            iVar33 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar15 = iVar33 + uVar15;
        }
      }
      else {
        uVar15 = (int)ppuVar3 - 1;
      }
      pPVar26 = local_40;
      uVar11 = uVar11 + uVar15;
      lVar31 = lVar31 + 0x28;
    } while (lVar31 != 0x2a8);
    pCVar4 = local_58->characterPlanes[0].rep.full.root;
    if (&DAT_00000004 < (undefined1 *)((long)&pCVar4[-1]._vptr_CharSetNode + 7)) {
      if (pCVar4 == (CharSetNode *)0x0) {
        uVar15 = CharBitvec::Count((CharBitvec *)_iStack_68);
      }
      else {
        if ((pCVar4 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar30 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2), 0xff00 < uVar30)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar7 = ppEStack_48;
          *(undefined4 *)ppEStack_48 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ecb7a0;
          *(undefined4 *)ppEVar7 = 0;
        }
        uVar15 = CharBitvec::Count((CharBitvec *)_iStack_68);
        pCVar4 = local_58->characterPlanes[0].rep.full.root;
        if (pCVar4 == (CharSetNode *)&CharSetFull::Instance) {
          iVar33 = 0xff00;
        }
        else {
          iVar33 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2);
        }
        uVar15 = iVar33 + uVar15;
      }
    }
    else {
      uVar15 = (int)pCVar4 - 1;
    }
    if (uVar11 != uVar15) {
      if (uVar15 == 0) {
        pNVar21 = (Node *)0x0;
        pNVar17 = (Node *)0x0;
      }
      else {
        negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
        local_6c = local_6c & 0xffff0000;
        bVar9 = CharSet<char16_t>::GetNextRange
                          (local_58->characterPlanes,L'\xd800',
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           (Char *)&local_6c);
        uVar6 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
        pNVar17 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
        pNVar17->tag = MatchSet;
        pNVar17->features = 0;
        *(uint *)&pNVar17->field_0xc = *(uint *)&pNVar17->field_0xc & 0xffff8000;
        pNVar17->firstSet = (CharSet<char16_t> *)0x0;
        pNVar17->followSet = (CharSet<char16_t> *)0x0;
        (pNVar17->prevConsumes).lower = 0;
        auVar38 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
        *(undefined1 (*) [16])&(pNVar17->prevConsumes).upper = auVar38;
        (pNVar17->followConsumes).upper = 0xffffffff;
        pNVar17->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&pNVar17[1]._vptr_Node = 0x100;
        pNVar34 = &pNVar17[1].tag;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
        pCVar28 = local_58;
        if ((bVar9) && ((ushort)uVar6 < 0xe000)) {
          CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                    (local_58,pPVar26->ctAllocator,(CharSet<char16_t> *)pNVar34);
          pPVar26 = local_40;
          pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,local_40->ctAllocator,0x364470);
          pNVar21->tag = MatchSet;
          pNVar21->features = 0;
          *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
          pNVar21->firstSet = (CharSet<char16_t> *)0x0;
          pNVar21->followSet = (CharSet<char16_t> *)0x0;
          (pNVar21->prevConsumes).lower = 0;
          auVar38 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
          *(undefined1 (*) [16])&(pNVar21->prevConsumes).upper = auVar38;
          (pNVar21->followConsumes).upper = 0xffffffff;
          pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
          *(undefined2 *)&pNVar21[1]._vptr_Node = 0x100;
          CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar21[1].tag);
          CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                    (pCVar28,pPVar26->ctAllocator,(CharSet<char16_t> *)&pNVar21[1].tag);
        }
        else {
          CharSet<unsigned_int>::CloneSimpleCharsTo
                    (local_58,pPVar26->ctAllocator,(CharSet<char16_t> *)pNVar34);
          pNVar21 = (Node *)0x0;
          pPVar26 = local_40;
        }
      }
      if (pPVar26->unicodeFlagPresent == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        ppEVar7 = ppEStack_48;
        *(undefined4 *)ppEStack_48 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
        if (!bVar9) {
LAB_00ecb7a0:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *(undefined4 *)ppEVar7 = 0;
      }
      if (pNVar17 == (Node *)0x0) {
        pAVar22 = (AltNode *)0x0;
      }
      else {
        pAVar22 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar26->ctAllocator,0x364470);
        (pAVar22->super_Node).tag = Alt;
        (pAVar22->super_Node).features = 0;
        puVar1 = &(pAVar22->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar22->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar22->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar22->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar22->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar22->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar22->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar22->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar22->head = pNVar17;
        pAVar22->switchSize = 0;
        pAVar22->tail = (AltNode *)0x0;
        pAVar22->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar22->runtimeTrie + 5) = 0;
      }
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
      local_6c = 0;
      _iStack_68 = pNVar21;
      bVar9 = CharSet<unsigned_int>::GetNextRange
                        (local_58,0x10000,
                         (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                         &local_6c);
      ppEVar7 = ppEStack_48;
      lastAltNode = pAVar22;
      if (bVar9) {
        do {
          if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_6c) {
            pAVar23 = AppendSurrogatePairToDisjunction
                                (local_40,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                 lastAltNode);
          }
          else {
            pAVar23 = AppendSurrogateRangeToDisjunction
                                (local_40,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                                 local_6c,lastAltNode);
          }
          if (pAVar22 == (AltNode *)0x0) {
            pAVar22 = pAVar23;
          }
          if (pAVar23 == (AltNode *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)ppEVar7 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
            if (!bVar9) goto LAB_00ecb7a0;
            *(undefined4 *)ppEVar7 = 0;
          }
          do {
            lastAltNode = pAVar23;
            pAVar23 = lastAltNode->tail;
          } while (lastAltNode->tail != (AltNode *)0x0);
          bVar9 = CharSet<unsigned_int>::GetNextRange
                            (local_58,local_6c + 1,
                             (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                             &local_6c);
        } while (bVar9);
      }
      pPVar26 = local_40;
      pNVar17 = _iStack_68;
      if (_iStack_68 != (Node *)0x0) {
        pAVar23 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_40->ctAllocator,0x364470);
        (pAVar23->super_Node).tag = Alt;
        (pAVar23->super_Node).features = 0;
        puVar1 = &(pAVar23->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar23->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar23->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar23->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar23->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar23->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar23->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar23->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar23->head = pNVar17;
        pAVar23->switchSize = 0;
        pAVar23->tail = (AltNode *)0x0;
        pAVar23->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar23->runtimeTrie + 5) = 0;
        lastAltNode->tail = pAVar23;
      }
      CharSet<unsigned_int>::Clear(local_58,pPVar26->ctAllocator);
      if (pAVar22 != (AltNode *)0x0) {
        if (pAVar22->tail != (AltNode *)0x0) {
          return &pAVar22->super_Node;
        }
        return pAVar22->head;
      }
      return (Node *)0x0;
    }
    pNVar17 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
    *(uint *)&pNVar17->field_0xc = *(uint *)&pNVar17->field_0xc & 0xffff8000;
    pNVar17->tag = MatchSet;
    pNVar17->features = 0;
    pNVar17->firstSet = (CharSet<char16_t> *)0x0;
    pNVar17->followSet = (CharSet<char16_t> *)0x0;
    (pNVar17->prevConsumes).lower = 0;
    auVar38 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar17->prevConsumes).upper = auVar38;
    (pNVar17->followConsumes).upper = 0xffffffff;
    pNVar17->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(bool *)&pNVar17[1]._vptr_Node = local_31 == '^';
    *(undefined1 *)((long)&pNVar17[1]._vptr_Node + 1) = 1;
    pNVar34 = &pNVar17[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar34);
    pAVar27 = pPVar26->ctAllocator;
    pCVar28 = local_58;
  }
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar28,pAVar27,(CharSet<char16_t> *)pNVar34);
  return pNVar17;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }